

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnElemSegment
          (SharedValidator *this,Location *loc,Var *table_var,SegmentKind kind)

{
  Result RVar1;
  Enum EVar2;
  ElemType local_64;
  Var local_60;
  
  EVar2 = Ok;
  if (kind == Active) {
    Var::Var(&local_60,table_var);
    RVar1 = CheckTableIndex(this,&local_60,(TableType *)0x0);
    EVar2 = (Enum)(RVar1.enum_ == Error);
    Var::~Var(&local_60);
  }
  local_64.element.enum_ = (Type)Void;
  std::vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>::
  emplace_back<wabt::SharedValidator::ElemType>(&this->elems_,&local_64);
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnElemSegment(const Location& loc,
                                      Var table_var,
                                      SegmentKind kind) {
  Result result = Result::Ok;
  if (kind == SegmentKind::Active) {
    result |= CheckTableIndex(table_var);
  }
  elems_.push_back(ElemType{Type::Void});  // Updated in OnElemSegmentElemType.
  return result;
}